

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::CentroidRenderCase::setupRenderData
          (CentroidRenderCase *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
  *this_00;
  undefined8 *puVar1;
  float *pfVar2;
  undefined4 *puVar3;
  int iVar4;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  long lVar6;
  int iVar7;
  float fVar8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  allocator<char> local_81;
  key_type local_80;
  float local_5c;
  _Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_58;
  float local_3c;
  float local_38;
  
  iVar4 = (*((this->super_MultisampleRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_58,
             0x708,(allocator_type *)&local_80);
  (this->super_MultisampleRenderCase).m_renderMode = 4;
  (this->super_MultisampleRenderCase).m_renderCount = 600;
  std::__cxx11::string::assign
            ((char *)&(this->super_MultisampleRenderCase).m_renderSceneDescription);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"a_position",&local_81);
  this_00 = &(this->super_MultisampleRenderCase).m_renderAttribs;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_80);
  pmVar5->offset = 0;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"a_position",&local_81);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_80);
  pmVar5->stride = 0x30;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"a_barycentricsA",&local_81);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_80);
  pmVar5->offset = 0x10;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"a_barycentricsA",&local_81);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_80);
  pmVar5->stride = 0x30;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"a_barycentricsB",&local_81);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_80);
  pmVar5->offset = 0x20;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"a_barycentricsB",&local_81);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
           ::operator[](this_00,&local_80);
  pmVar5->stride = 0x30;
  std::__cxx11::string::~string((string *)&local_80);
  iVar7 = 0;
  for (lVar6 = 0; lVar6 != 0x7080; lVar6 = lVar6 + 0x90) {
    fVar8 = (float)iVar7 / 200.0;
    local_3c = (fVar8 + fVar8) * 3.1415927;
    fVar8 = ((float)iVar7 + 1.0) / 200.0;
    local_5c = (fVar8 + fVar8) * 3.1415927;
    puVar1 = (undefined8 *)
             ((long)(local_58._M_impl.super__Vector_impl_data._M_start)->m_data + lVar6);
    *puVar1 = 0xbe99999a3e4ccccd;
    puVar1[1] = 0x3f80000000000000;
    puVar1 = (undefined8 *)
             ((long)local_58._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar6);
    *puVar1 = 0x3f800000;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)local_58._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar6);
    *puVar1 = 0x3f800000;
    puVar1[1] = 0;
    local_38 = cosf(local_3c);
    fVar8 = sinf(local_3c);
    pfVar2 = (float *)((long)local_58._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar6);
    *pfVar2 = local_38 + local_38;
    pfVar2[1] = fVar8 + fVar8;
    pfVar2[2] = 0.0;
    pfVar2[3] = 1.0;
    puVar1 = (undefined8 *)
             ((long)local_58._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar6);
    *puVar1 = 0x3f80000000000000;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)local_58._M_impl.super__Vector_impl_data._M_start[5].m_data + lVar6);
    *puVar1 = 0x3f80000000000000;
    puVar1[1] = 0;
    local_38 = cosf(local_5c);
    fVar8 = sinf(local_5c);
    pfVar2 = (float *)((long)local_58._M_impl.super__Vector_impl_data._M_start[6].m_data + lVar6);
    *pfVar2 = local_38 + local_38;
    pfVar2[1] = fVar8 + fVar8;
    pfVar2[2] = 0.0;
    pfVar2[3] = 1.0;
    puVar3 = (undefined4 *)
             ((long)local_58._M_impl.super__Vector_impl_data._M_start[7].m_data + lVar6);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0x3f800000;
    puVar3[3] = 0;
    puVar3 = (undefined4 *)
             ((long)local_58._M_impl.super__Vector_impl_data._M_start[8].m_data + lVar6);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0x3f800000;
    puVar3[3] = 0;
    iVar7 = iVar7 + 1;
  }
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x40))
            (0x8892,(this->super_MultisampleRenderCase).m_buffer);
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x150))
            (0x8892,(long)local_58._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58._M_impl.super__Vector_impl_data._M_start,
             local_58._M_impl.super__Vector_impl_data._M_start,0x88e4);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&local_58);
  return;
}

Assistant:

void CentroidRenderCase::setupRenderData (void)
{
	const int				numTriangles	= 200;
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	std::vector<tcu::Vec4>	data			(numTriangles * 3 * 3);

	m_renderMode = GL_TRIANGLES;
	m_renderCount = numTriangles * 3;
	m_renderSceneDescription = "triangle fan of narrow triangles";

	m_renderAttribs["a_position"].offset = 0;
	m_renderAttribs["a_position"].stride = (int)sizeof(float[4]) * 3;
	m_renderAttribs["a_barycentricsA"].offset = (int)sizeof(float[4]);
	m_renderAttribs["a_barycentricsA"].stride = (int)sizeof(float[4]) * 3;
	m_renderAttribs["a_barycentricsB"].offset = (int)sizeof(float[4]) * 2;
	m_renderAttribs["a_barycentricsB"].stride = (int)sizeof(float[4]) * 3;

	for (int triangleNdx = 0; triangleNdx < numTriangles; ++triangleNdx)
	{
		const float angle		= ((float)triangleNdx) / (float)numTriangles * 2.0f * DE_PI;
		const float nextAngle	= ((float)triangleNdx + 1.0f) / (float)numTriangles * 2.0f * DE_PI;

		data[(triangleNdx * 3 + 0) * 3 + 0] = tcu::Vec4(0.2f, -0.3f, 0.0f, 1.0f);
		data[(triangleNdx * 3 + 0) * 3 + 1] = tcu::Vec4(1.0f,  0.0f, 0.0f, 0.0f);
		data[(triangleNdx * 3 + 0) * 3 + 2] = tcu::Vec4(1.0f,  0.0f, 0.0f, 0.0f);

		data[(triangleNdx * 3 + 1) * 3 + 0] = tcu::Vec4(2.0f * deFloatCos(angle), 2.0f * deFloatSin(angle), 0.0f, 1.0f);
		data[(triangleNdx * 3 + 1) * 3 + 1] = tcu::Vec4(0.0f,  1.0f, 0.0f, 0.0f);
		data[(triangleNdx * 3 + 1) * 3 + 2] = tcu::Vec4(0.0f,  1.0f, 0.0f, 0.0f);

		data[(triangleNdx * 3 + 2) * 3 + 0] = tcu::Vec4(2.0f * deFloatCos(nextAngle), 2.0f * deFloatSin(nextAngle), 0.0f, 1.0f);
		data[(triangleNdx * 3 + 2) * 3 + 1] = tcu::Vec4(0.0f,  0.0f, 1.0f, 0.0f);
		data[(triangleNdx * 3 + 2) * 3 + 2] = tcu::Vec4(0.0f,  0.0f, 1.0f, 0.0f);
	}

	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer);
	gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(data.size() * sizeof(tcu::Vec4)), data[0].getPtr(), GL_STATIC_DRAW);
}